

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mie.cpp
# Opt level: O3

void __thiscall
OpenMD::Mie::addExplicitInteraction
          (Mie *this,AtomType *atype1,AtomType *atype2,RealType sigma,RealType epsilon,int nRep,
          int mAtt)

{
  pointer piVar1;
  pointer pvVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  size_type __new_size;
  int iVar9;
  double dVar10;
  double dVar11;
  pair<std::_Rb_tree_iterator<int>,_bool> pVar12;
  int atid2;
  int atid1;
  int local_4c;
  RealType local_48;
  double local_40;
  int local_34;
  
  dVar11 = (double)nRep;
  dVar10 = (double)mAtt;
  local_40 = dVar11 - dVar10;
  local_48 = epsilon;
  dVar10 = pow(dVar11 / dVar10,dVar10 / local_40);
  iVar8 = (int)(this->MieTypes)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  local_34 = AtomType::getIdent(atype1);
  local_4c = AtomType::getIdent(atype2);
  pVar12 = std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
           _M_insert_unique<int_const&>
                     ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                      &this->MieTypes,&local_34);
  piVar1 = (this->MieTids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pVar12.second == false) {
    iVar9 = piVar1[local_34];
    iVar5 = iVar8;
  }
  else {
    piVar1[local_34] = iVar8;
    iVar5 = iVar8 + 1;
    iVar9 = iVar8;
  }
  dVar10 = (dVar10 * dVar11) / local_40;
  pVar12 = std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
           _M_insert_unique<int_const&>
                     ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                      &this->MieTypes,&local_4c);
  piVar1 = (this->MieTids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pVar12.second == false) {
    iVar8 = piVar1[local_4c];
    iVar6 = iVar5;
  }
  else {
    piVar1[local_4c] = iVar5;
    iVar6 = iVar5 + 1;
    iVar8 = iVar5;
  }
  __new_size = (size_type)iVar6;
  std::
  vector<std::vector<OpenMD::MieInteractionData,_std::allocator<OpenMD::MieInteractionData>_>,_std::allocator<std::vector<OpenMD::MieInteractionData,_std::allocator<OpenMD::MieInteractionData>_>_>_>
  ::resize(&this->MixingMap,__new_size);
  lVar7 = (long)iVar9;
  std::vector<OpenMD::MieInteractionData,_std::allocator<OpenMD::MieInteractionData>_>::resize
            ((this->MixingMap).
             super__Vector_base<std::vector<OpenMD::MieInteractionData,_std::allocator<OpenMD::MieInteractionData>_>,_std::allocator<std::vector<OpenMD::MieInteractionData,_std::allocator<OpenMD::MieInteractionData>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + lVar7,__new_size);
  pvVar2 = (this->MixingMap).
           super__Vector_base<std::vector<OpenMD::MieInteractionData,_std::allocator<OpenMD::MieInteractionData>_>,_std::allocator<std::vector<OpenMD::MieInteractionData,_std::allocator<OpenMD::MieInteractionData>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar4 = (long)iVar8;
  lVar3 = *(long *)&pvVar2[lVar7].
                    super__Vector_base<OpenMD::MieInteractionData,_std::allocator<OpenMD::MieInteractionData>_>
                    ._M_impl.super__Vector_impl_data;
  *(RealType *)(lVar3 + lVar4 * 0x28) = sigma;
  *(RealType *)(lVar3 + 8 + lVar4 * 0x28) = local_48;
  *(double *)(lVar3 + 0x10 + lVar4 * 0x28) = 1.0 / sigma;
  *(int *)(lVar3 + 0x18 + lVar4 * 0x28) = nRep;
  *(int *)(lVar3 + 0x1c + lVar4 * 0x28) = mAtt;
  *(double *)(lVar3 + 0x20 + lVar4 * 0x28) = dVar10;
  if (iVar8 != iVar9) {
    std::vector<OpenMD::MieInteractionData,_std::allocator<OpenMD::MieInteractionData>_>::resize
              (pvVar2 + lVar4,__new_size);
    lVar3 = *(long *)&(this->MixingMap).
                      super__Vector_base<std::vector<OpenMD::MieInteractionData,_std::allocator<OpenMD::MieInteractionData>_>,_std::allocator<std::vector<OpenMD::MieInteractionData,_std::allocator<OpenMD::MieInteractionData>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[lVar4].
                      super__Vector_base<OpenMD::MieInteractionData,_std::allocator<OpenMD::MieInteractionData>_>
                      ._M_impl.super__Vector_impl_data;
    *(RealType *)(lVar3 + lVar7 * 0x28) = sigma;
    *(RealType *)(lVar3 + 8 + lVar7 * 0x28) = local_48;
    *(double *)(lVar3 + 0x10 + lVar7 * 0x28) = 1.0 / sigma;
    *(int *)(lVar3 + 0x18 + lVar7 * 0x28) = nRep;
    *(int *)(lVar3 + 0x1c + lVar7 * 0x28) = mAtt;
    *(double *)(lVar3 + 0x20 + lVar7 * 0x28) = dVar10;
  }
  return;
}

Assistant:

void Mie::addExplicitInteraction(AtomType* atype1, AtomType* atype2,
                                   RealType sigma, RealType epsilon, int nRep,
                                   int mAtt) {
    MieInteractionData mixer;
    mixer.sigma   = sigma;
    mixer.epsilon = epsilon;
    mixer.sigmai  = 1.0 / mixer.sigma;
    mixer.nRep    = nRep;
    mixer.mAtt    = mAtt;

    RealType n = RealType(nRep);
    RealType m = RealType(mAtt);

    mixer.nmScale = n * pow(n / m, m / (n - m)) / (n - m);

    int nMie  = MieTypes.size();
    int atid1 = atype1->getIdent();
    int atid2 = atype2->getIdent();
    int mietid1, mietid2;

    pair<set<int>::iterator, bool> ret;
    ret = MieTypes.insert(atid1);
    if (ret.second == false) {
      // already had this type in the MieMap, just get the mietid:
      mietid1 = MieTids[atid1];
    } else {
      // didn't already have it, so make a new one and assign it:
      mietid1        = nMie;
      MieTids[atid1] = nMie;
      nMie++;
    }

    ret = MieTypes.insert(atid2);
    if (ret.second == false) {
      // already had this type in the MieMap, just get the mietid:
      mietid2 = MieTids[atid2];
    } else {
      // didn't already have it, so make a new one and assign it:
      mietid2        = nMie;
      MieTids[atid2] = nMie;
      nMie++;
    }

    MixingMap.resize(nMie);
    MixingMap[mietid1].resize(nMie);

    MixingMap[mietid1][mietid2] = mixer;
    if (mietid2 != mietid1) {
      MixingMap[mietid2].resize(nMie);
      MixingMap[mietid2][mietid1] = mixer;
    }
  }